

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall
crypto_tests::CryptoTest::TestPoly1305
          (CryptoTest *this,string *hexmessage,string *hexkey,string *hextag)

{
  long lVar1;
  long lVar2;
  size_t __n;
  int iVar3;
  uint uVar4;
  value_type *__val;
  uint64_t bytes;
  pointer m_00;
  uint64_t maxval;
  ulong bytes_00;
  ulong uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_std::byte> key_00;
  Span<std::byte> out;
  const_string file;
  Span<const_unsigned_char> s;
  Span<const_std::byte> key_01;
  Span<std::byte> out_00;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  const_string msg;
  const_string msg_00;
  int local_1e8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  vector<std::byte,_std::allocator<std::byte>_> local_190;
  vector<std::byte,_std::allocator<std::byte>_> m;
  vector<std::byte,_std::allocator<std::byte>_> key;
  string *local_148;
  lazy_ostream local_140;
  undefined1 *local_130;
  string **local_128;
  string *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  string **local_100;
  string *local_f8;
  char *local_f0;
  assertion_result local_e8;
  string local_d0;
  undefined1 local_b0 [8];
  bool local_a8;
  undefined7 uStack_a7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  Poly1305 poly1305;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  ParseHex<std::byte>(&key,hex_str);
  hex_str_00._M_str = (hexmessage->_M_dataplus)._M_p;
  hex_str_00._M_len = hexmessage->_M_string_length;
  ParseHex<std::byte>(&m,hex_str_00);
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start + 0x10;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[5] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[6] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  key_00.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_00.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Poly1305::Poly1305((Poly1305 *)&poly1305.m_ctx,key_00);
  poly1305_donna::poly1305_update
            (&poly1305.m_ctx,
             m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
  out.m_size = (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
  out.m_data = local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
  Poly1305::Finalize((Poly1305 *)&poly1305.m_ctx,out);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xeb;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = (string **)0xf4aea1;
  s.m_size = (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_((string *)local_b0,s);
  __n = CONCAT71(uStack_a7,local_a8);
  if (__n == hextag->_M_string_length) {
    if (__n == 0) {
      local_d0._M_dataplus._M_p._0_1_ = true;
    }
    else {
      iVar3 = bcmp((void *)local_b0,(hextag->_M_dataplus)._M_p,__n);
      local_d0._M_dataplus._M_p._0_1_ = iVar3 == 0;
    }
  }
  else {
    local_d0._M_dataplus._M_p._0_1_ = false;
  }
  local_d0._M_string_length = 0;
  local_d0.field_2._M_allocated_capacity = 0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_e8.m_message.px = (element_type *)0xe4cf45;
  poly1305.m_ctx.h._4_8_ = &local_f8;
  poly1305.m_ctx.r[2]._0_1_ = 0;
  poly1305.m_ctx.r._0_8_ = &PTR__lazy_ostream_01388fc8;
  poly1305.m_ctx._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01388fc8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_120 = hextag;
  local_f8 = (string *)local_b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d0,&local_140,1,2,REQUIRE,0xe5c48d,(size_t)&local_e8,0xeb,
             &poly1305.m_ctx,"hextag",&local_118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d0.field_2._M_allocated_capacity);
  if (local_b0 != (undefined1  [8])&local_a0) {
    operator_delete((void *)local_b0,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  local_1e8 = 0;
  do {
    iVar3 = 0;
    do {
      m_00 = m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
      bytes_00 = (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
      key_01.m_size =
           (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      key_01.m_data =
           key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      Poly1305::Poly1305(&poly1305,key_01);
      if (local_1e8 != 0) {
        iVar8 = 0;
        uVar5 = bytes_00;
        do {
          if (uVar5 == 0) {
            uVar4 = 0x40;
          }
          else {
            lVar2 = 0x3f;
            if (uVar5 != 0) {
              for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            uVar4 = (uint)lVar2 ^ 0x3f;
          }
          do {
            bytes = RandomMixin<FastRandomContext>::randbits
                              (&(this->super_BasicTestingSetup).m_rng.
                                super_RandomMixin<FastRandomContext>,0x40 - uVar4);
            bytes_00 = uVar5 - bytes;
          } while (uVar5 < bytes);
          poly1305_donna::poly1305_update(&poly1305.m_ctx,m_00,bytes);
          m_00 = m_00 + bytes;
          iVar8 = iVar8 + 1;
          uVar5 = bytes_00;
        } while (iVar8 != local_1e8);
      }
      local_118 = (undefined **)((ulong)local_118 & 0xffffffffffffff00);
      std::vector<std::byte,_std::allocator<std::byte>_>::_M_fill_assign
                (&local_190,0x10,(value_type *)&local_118);
      poly1305_donna::poly1305_update(&poly1305.m_ctx,m_00,bytes_00);
      out_00.m_size =
           (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      out_00.m_data =
           local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      Poly1305::Finalize((Poly1305 *)&poly1305.m_ctx,out_00);
      local_1c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_1b8 = "";
      local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xf9;
      file_00.m_begin = (iterator)&local_1c0;
      msg_00.m_end = pvVar7;
      msg_00.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d0,
                 msg_00);
      local_a8 = false;
      local_b0 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
      local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      s_00.m_size = (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      s_00.m_data = local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      HexStr_abi_cxx11_(&local_d0,s_00);
      if (local_d0._M_string_length == hextag->_M_string_length) {
        if (local_d0._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar8 = bcmp((void *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                        local_d0._M_dataplus._M_p._0_1_),(hextag->_M_dataplus)._M_p,
                       local_d0._M_string_length);
          bVar9 = iVar8 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar9;
      local_e8.m_message.px = (element_type *)0x0;
      local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_f8 = (string *)0xe4cee0;
      local_f0 = "";
      local_120 = &local_d0;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_01388fc8;
      local_108 = boost::unit_test::lazy_ostream::inst;
      local_100 = &local_120;
      local_140.m_empty = false;
      local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388fc8;
      local_130 = boost::unit_test::lazy_ostream::inst;
      local_128 = &local_148;
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x2;
      local_148 = hextag;
      boost::test_tools::tt_detail::report_assertion
                (&local_e8,(lazy_ostream *)local_b0,1,2,REQUIRE,0xe5c48d,(size_t)&local_f8,0xf9,
                 &local_118,"hextag",&local_140);
      boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_) !=
          &local_d0.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_)
                        ,local_d0.field_2._M_allocated_capacity + 1);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 10);
    local_1e8 = local_1e8 + 1;
  } while (local_1e8 != 10);
  if (local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestPoly1305(const std::string &hexmessage, const std::string &hexkey, const std::string& hextag)
{
    auto key = ParseHex<std::byte>(hexkey);
    auto m = ParseHex<std::byte>(hexmessage);
    std::vector<std::byte> tagres(Poly1305::TAGLEN);
    Poly1305{key}.Update(m).Finalize(tagres);
    BOOST_CHECK_EQUAL(HexStr(tagres), hextag);

    // Test incremental interface
    for (int splits = 0; splits < 10; ++splits) {
        for (int iter = 0; iter < 10; ++iter) {
            auto data = Span{m};
            Poly1305 poly1305{key};
            for (int chunk = 0; chunk < splits; ++chunk) {
                size_t now = m_rng.randrange(data.size() + 1);
                poly1305.Update(data.first(now));
                data = data.subspan(now);
            }
            tagres.assign(Poly1305::TAGLEN, std::byte{});
            poly1305.Update(data).Finalize(tagres);
            BOOST_CHECK_EQUAL(HexStr(tagres), hextag);
        }
    }
}